

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

void Imf_3_4::skipChannel(char **readPtr,PixelType typeInFile,size_t xSize)

{
  ArgExc *this;
  int in_ESI;
  int in_stack_000003bc;
  char **in_stack_000003c0;
  
  if (in_ESI == 0) {
    Xdr::size<unsigned_int>();
    Xdr::skip<Imf_3_4::CharPtrIO,char_const*>(in_stack_000003c0,in_stack_000003bc);
  }
  else if (in_ESI == 1) {
    Xdr::size<Imath_3_2::half>();
    Xdr::skip<Imf_3_4::CharPtrIO,char_const*>(in_stack_000003c0,in_stack_000003bc);
  }
  else {
    if (in_ESI != 2) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
      __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    Xdr::size<float>();
    Xdr::skip<Imf_3_4::CharPtrIO,char_const*>(in_stack_000003c0,in_stack_000003bc);
  }
  return;
}

Assistant:

void
skipChannel (const char*& readPtr, PixelType typeInFile, size_t xSize)
{
    switch (typeInFile)
    {
        case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            Xdr::skip<CharPtrIO> (readPtr, Xdr::size<unsigned int> () * xSize);
            break;

        case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            Xdr::skip<CharPtrIO> (readPtr, Xdr::size<half> () * xSize);
            break;

        case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            Xdr::skip<CharPtrIO> (readPtr, Xdr::size<float> () * xSize);
            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
    }
}